

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OclBackend.cpp
# Opt level: O2

void __thiscall xmrig::OclBackend::setJob(OclBackend *this,Job *job)

{
  OclLaunchData *__first1;
  OclLaunchData *__last1;
  bool bVar1;
  int iVar2;
  Config *this_00;
  OclConfig *this_01;
  Miner *miner;
  char *fmt;
  vector<xmrig::OclLaunchData,_std::allocator<xmrig::OclLaunchData>_> threads;
  
  this_00 = Base::config(&this->d_ptr->controller->super_Base);
  this_01 = Config::cl(this_00);
  if (this_01->m_enabled == true) {
    OclBackendPrivate::init(this->d_ptr,(EVP_PKEY_CTX *)this_01);
  }
  iVar2 = (*(this->super_IBackend)._vptr_IBackend[2])(this);
  if ((char)iVar2 == '\0') {
    (*(this->super_IBackend)._vptr_IBackend[0xb])(this);
    return;
  }
  miner = Controller::miner(this->d_ptr->controller);
  OclConfig::get(&threads,this_01,miner,&this->d_ptr->platform,&this->d_ptr->devices);
  __first1 = (this->d_ptr->threads).
             super__Vector_base<xmrig::OclLaunchData,_std::allocator<xmrig::OclLaunchData>_>._M_impl
             .super__Vector_impl_data._M_start;
  __last1 = (this->d_ptr->threads).
            super__Vector_base<xmrig::OclLaunchData,_std::allocator<xmrig::OclLaunchData>_>._M_impl.
            super__Vector_impl_data._M_finish;
  if (((__first1 == __last1) ||
      ((long)__last1 - (long)__first1 !=
       (long)threads.super__Vector_base<xmrig::OclLaunchData,_std::allocator<xmrig::OclLaunchData>_>
             ._M_impl.super__Vector_impl_data._M_finish -
       (long)threads.super__Vector_base<xmrig::OclLaunchData,_std::allocator<xmrig::OclLaunchData>_>
             ._M_impl.super__Vector_impl_data._M_start)) ||
     (bVar1 = std::__equal<false>::equal<xmrig::OclLaunchData*,xmrig::OclLaunchData*>
                        (__first1,__last1,
                         threads.
                         super__Vector_base<xmrig::OclLaunchData,_std::allocator<xmrig::OclLaunchData>_>
                         ._M_impl.super__Vector_impl_data._M_start), !bVar1)) {
    if (threads.super__Vector_base<xmrig::OclLaunchData,_std::allocator<xmrig::OclLaunchData>_>.
        _M_impl.super__Vector_impl_data._M_start ==
        threads.super__Vector_base<xmrig::OclLaunchData,_std::allocator<xmrig::OclLaunchData>_>.
        _M_impl.super__Vector_impl_data._M_finish) {
      fmt = "%s \x1b[1;31mdisabled\x1b[0m\x1b[0;33m (no suitable configuration found)\x1b[0m";
    }
    else {
      iVar2 = OclContext::init(&this->d_ptr->context,(EVP_PKEY_CTX *)&this->d_ptr->devices);
      if ((char)iVar2 != '\0') {
        (*(this->super_IBackend)._vptr_IBackend[0xb])(this);
        std::vector<xmrig::OclLaunchData,_std::allocator<xmrig::OclLaunchData>_>::_M_move_assign
                  (&this->d_ptr->threads,&threads);
        OclBackendPrivate::start(this->d_ptr,job);
        goto LAB_0016c179;
      }
      fmt = "%s \x1b[1;31mdisabled\x1b[0m\x1b[0;33m (OpenCL context unavailable)\x1b[0m";
    }
    Log::print(WARNING,fmt,"\x1b[45;1m\x1b[1;37m ocl \x1b[0m");
    (*(this->super_IBackend)._vptr_IBackend[0xb])(this);
  }
LAB_0016c179:
  std::vector<xmrig::OclLaunchData,_std::allocator<xmrig::OclLaunchData>_>::~vector(&threads);
  return;
}

Assistant:

void xmrig::OclBackend::setJob(const Job &job)
{
    const auto &cl = d_ptr->controller->config()->cl();
    if (cl.isEnabled()) {
        d_ptr->init(cl);
    }

    if (!isEnabled()) {
        return stop();
    }

    auto threads = cl.get(d_ptr->controller->miner(), d_ptr->platform, d_ptr->devices);
    if (!d_ptr->threads.empty() && d_ptr->threads.size() == threads.size() && std::equal(d_ptr->threads.begin(), d_ptr->threads.end(), threads.begin())) {
        return;
    }

    if (threads.empty()) {
        LOG_WARN("%s " RED_BOLD("disabled") YELLOW(" (no suitable configuration found)"), tag);

        return stop();
    }

    if (!d_ptr->context.init(d_ptr->devices, threads)) {
        LOG_WARN("%s " RED_BOLD("disabled") YELLOW(" (OpenCL context unavailable)"), tag);

        return stop();
    }

    stop();

    d_ptr->threads = std::move(threads);
    d_ptr->start(job);
}